

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_text_string
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,string_type *str,
          error_code *ec)

{
  byte bVar1;
  byte *pbVar2;
  pointer pvVar3;
  ulong uVar4;
  size_t sVar5;
  assertion_error *this_00;
  anon_class_8_1_ba1d7991 func;
  mapped_string local_68;
  
  pbVar2 = (this->source_).current_;
  if (pbVar2 < (this->source_).end_) {
    bVar1 = *pbVar2;
    if ((bVar1 & 0xe0) != 0x60) {
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,
                 "assertion \'major_type == jsoncons::cbor::detail::cbor_major_type::text_string\' failed at  <> :0"
                 ,(allocator<char> *)&func);
      assertion_error::assertion_error(this_00,(string *)&local_68);
      __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    func.str = str;
    basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::
    iterate_string_chunks<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_text_string(std::__cxx11::string&,std::error_code&)::_lambda(jsoncons::bytes_source&,unsigned_long,std::error_code&)_1_>
              ((basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>> *)this,&func,
               text_string,ec);
    if (((~bVar1 & 0x1f) != 0) &&
       (pvVar3 = (this->stringref_map_stack_).
                 super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
       (this->stringref_map_stack_).
       super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start != pvVar3)) {
      uVar4 = str->_M_string_length;
      sVar5 = detail::min_length_for_stringref
                        ((long)pvVar3[-1].
                               super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)pvVar3[-1].
                               super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 6);
      if (sVar5 <= uVar4) {
        pvVar3 = (this->stringref_map_stack_).
                 super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        mapped_string::mapped_string(&local_68,str,(allocator_type *)&this->field_0x28);
        std::
        vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::mapped_string,std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::mapped_string>>
        ::
        emplace_back<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::mapped_string>
                  ((vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::mapped_string,std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::mapped_string>>
                    *)(pvVar3 + -1),&local_68);
        mapped_string::~mapped_string(&local_68);
      }
    }
  }
  else {
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
  }
  return;
}

Assistant:

void read_text_string(string_type& str, std::error_code& ec)
    {
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);
        uint8_t info = get_additional_information_value(c.value);

        JSONCONS_ASSERT(major_type == jsoncons::cbor::detail::cbor_major_type::text_string);
        auto func = [&str](Source& source, std::size_t length, std::error_code& ec) -> bool
        {
            if (source_reader<Source>::read(source, str, length) != length)
            {
                ec = cbor_errc::unexpected_eof;
                return false;
            }
            return true;
        };
        iterate_string_chunks(func, major_type, ec);

        if (!stringref_map_stack_.empty() && 
            info != jsoncons::cbor::detail::additional_info::indefinite_length &&
            str.length() >= jsoncons::cbor::detail::min_length_for_stringref(stringref_map_stack_.back().size()))
        {
            stringref_map_stack_.back().emplace_back(mapped_string(str,alloc_));
        }

    }